

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

base_learner * OjaNewton_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  option_group_definition *poVar4;
  typed_option<int> *ptVar5;
  typed_option<float> *ptVar6;
  float *pfVar7;
  float **ppfVar8;
  example **ppeVar9;
  learner<OjaNewton,_example> *plVar10;
  uint32_t *puVar11;
  int i;
  long lVar12;
  __type_conflict __x;
  double dVar13;
  free_ptr<OjaNewton> ON;
  allocator local_7dd;
  allocator local_7dc;
  allocator local_7db;
  allocator local_7da;
  allocator local_7d9;
  allocator local_7d8;
  allocator local_7d7;
  allocator local_7d6;
  allocator local_7d5;
  allocator local_7d4;
  allocator local_7d3;
  allocator local_7d2;
  allocator local_7d1;
  allocator local_7d0;
  allocator local_7cf;
  allocator local_7ce;
  bool oja_newton;
  float alpha_inverse;
  string random_init;
  string normalize;
  string local_788 [32];
  string local_768;
  string local_748 [32];
  string local_728;
  string local_708 [32];
  string local_6e8;
  string local_6c8 [32];
  string local_6a8;
  string local_688 [32];
  string local_668;
  string local_648 [32];
  string local_628;
  string local_608 [32];
  string local_5e8;
  string local_5c8 [32];
  string local_5a8;
  string local_588;
  undefined1 local_568 [112];
  bool local_4f8;
  option_group_definition new_options;
  typed_option<int> local_490;
  undefined1 local_3f0 [160];
  undefined1 local_350 [160];
  undefined1 local_2b0 [160];
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<int> local_d0;
  
  scoped_calloc_or_throw<OjaNewton>();
  std::__cxx11::string::string((string *)&normalize,"true",(allocator *)local_568);
  std::__cxx11::string::string((string *)&random_init,"true",(allocator *)local_568);
  std::__cxx11::string::string((string *)&local_588,"OjaNewton options",(allocator *)local_568);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::string((string *)&local_5a8,"OjaNewton",&local_7ce);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_568,&local_5a8,&oja_newton);
  local_4f8 = true;
  std::__cxx11::string::string(local_5c8,"Online Newton with Oja\'s Sketch",&local_7cf);
  std::__cxx11::string::_M_assign((string *)(local_568 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)local_568);
  std::__cxx11::string::string((string *)&local_5e8,"sketch_size",&local_7d0);
  VW::config::typed_option<int>::typed_option
            (&local_490,&local_5e8,
             &(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m);
  ptVar5 = VW::config::typed_option<int>::default_value(&local_490,10);
  std::__cxx11::string::string(local_608,"size of sketch",&local_7d1);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar4,ptVar5);
  std::__cxx11::string::string((string *)&local_628,"epoch_size",&local_7d2);
  VW::config::typed_option<int>::typed_option
            (&local_d0,&local_628,
             &(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size);
  ptVar5 = VW::config::typed_option<int>::default_value(&local_d0,1);
  std::__cxx11::string::string(local_648,"size of epoch",&local_7d3);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar4,ptVar5);
  std::__cxx11::string::string((string *)&local_668,"alpha",&local_7d4);
  VW::config::typed_option<float>::typed_option
            (&local_170,&local_668,
             &(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->alpha);
  ptVar6 = VW::config::typed_option<float>::default_value(&local_170,1.0);
  std::__cxx11::string::string(local_688,"mutiplicative constant for indentiy",&local_7d5);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,ptVar6)
  ;
  std::__cxx11::string::string((string *)&local_6a8,"alpha_inverse",&local_7d6);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_2b0,&local_6a8,&alpha_inverse);
  std::__cxx11::string::string(local_6c8,"one over alpha, similar to learning rate",&local_7d7);
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar4,(typed_option<float> *)local_2b0);
  std::__cxx11::string::string((string *)&local_6e8,"learning_rate_cnt",&local_7d8);
  VW::config::typed_option<float>::typed_option
            (&local_210,&local_6e8,
             &(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->learning_rate_cnt);
  ptVar6 = VW::config::typed_option<float>::default_value(&local_210,2.0);
  std::__cxx11::string::string(local_708,"constant for the learning rate 1/t",&local_7d9);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,ptVar6)
  ;
  std::__cxx11::string::string((string *)&local_728,"normalize",&local_7da);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_350,&local_728,&normalize);
  std::__cxx11::string::string(local_748,"normalize the features or not",&local_7db);
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar4,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_350);
  std::__cxx11::string::string((string *)&local_768,"random_init",&local_7dc);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3f0,&local_768,&random_init);
  std::__cxx11::string::string(local_788,"randomize initialization of Oja or not",&local_7dd);
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar4,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_3f0);
  std::__cxx11::string::~string(local_788);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_3f0);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string(local_748);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_350);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string(local_708);
  VW::config::typed_option<float>::~typed_option(&local_210);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string(local_6c8);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_2b0);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string(local_688);
  VW::config::typed_option<float>::~typed_option(&local_170);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string(local_648);
  VW::config::typed_option<int>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string(local_608);
  VW::config::typed_option<int>::~typed_option(&local_490);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string(local_5c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_568);
  std::__cxx11::string::~string((string *)&local_5a8);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)local_568,"OjaNewton",(allocator *)&local_490);
  iVar3 = (*options->_vptr_options_i[1])(options,local_568);
  std::__cxx11::string::~string((string *)local_568);
  if ((char)iVar3 == '\0') {
    plVar10 = (learner<OjaNewton,_example> *)0x0;
  }
  else {
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->all = all;
    bVar2 = std::operator==(&normalize,"true");
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->normalize = bVar2;
    bVar2 = std::operator==(&random_init,"true");
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->random_init = bVar2;
    std::__cxx11::string::string((string *)local_568,"alpha_inverse",(allocator *)&local_490);
    iVar3 = (*options->_vptr_options_i[1])(options,local_568);
    std::__cxx11::string::~string((string *)local_568);
    if ((char)iVar3 != '\0') {
      (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->alpha = 1.0 / alpha_inverse;
    }
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->cnt = 0;
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->t = 1;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->ev = pfVar7;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->b = pfVar7;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->D = pfVar7;
    ppfVar8 = calloc_or_throw<float*>
                        ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->A = ppfVar8;
    ppfVar8 = calloc_or_throw<float*>
                        ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->K = ppfVar8;
    for (lVar12 = 1;
        lVar12 <= (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m; lVar12 = lVar12 + 1)
    {
      pfVar7 = calloc_or_throw<float>
                         ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                                 super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
      (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->A[lVar12] = pfVar7;
      pfVar7 = calloc_or_throw<float>
                         ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                                 super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
      (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->K[lVar12] = pfVar7;
      (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->A[lVar12][lVar12] = 1.0;
      (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->K[lVar12][lVar12] = 1.0;
      (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->D[lVar12] = 1.0;
    }
    ppeVar9 = calloc_or_throw<example*>
                        ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size)
    ;
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->buffer = ppeVar9;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->weight_buffer = pfVar7;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->zv = pfVar7;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->vv = pfVar7;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->tmp = pfVar7;
    ((ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).ON =
         ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).Zx = pfVar7;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).AZx = pfVar7;
    pfVar7 = calloc_or_throw<float>
                       ((long)(ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).delta = pfVar7;
    __x = std::log2<int>((ON._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                          super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 2);
    dVar13 = ceil(__x);
    parameters::stride_shift(&all->weights,(uint32_t)(long)dVar13);
    puVar11 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar11 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar10 = LEARNER::init_learner<OjaNewton,example,LEARNER::learner<char,char>>
                        (&ON,learn,predict,(ulong)(uint)(1 << ((byte)*puVar11 & 0x1f)));
    *(code **)(plVar10 + 0x80) = save_load;
    uVar1 = *(undefined8 *)(plVar10 + 0x18);
    *(undefined8 *)(plVar10 + 0x70) = uVar1;
    *(undefined8 *)(plVar10 + 0x78) = *(undefined8 *)(plVar10 + 0x20);
    *(undefined8 *)(plVar10 + 0x58) = uVar1;
    *(code **)(plVar10 + 0x68) = keep_example;
    *(undefined8 *)(plVar10 + 0xb8) = uVar1;
    *(undefined8 *)(plVar10 + 0xc0) = *(undefined8 *)(plVar10 + 0x20);
    *(code **)(plVar10 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&random_init);
  std::__cxx11::string::~string((string *)&normalize);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::~unique_ptr(&ON);
  return (base_learner *)plVar10;
}

Assistant:

base_learner* OjaNewton_setup(options_i& options, vw& all)
{
  auto ON = scoped_calloc_or_throw<OjaNewton>();

  bool oja_newton;
  float alpha_inverse;

  // These two are the only two boolean options that default to true. For now going to do this hack
  // as the infrastructure doesn't easily support this possibility at the same time providing the
  // ease of bool switches elsewhere. It seems that the switch behavior is more critical because
  // of the positional data argument.
  std::string normalize = "true";
  std::string random_init = "true";
  option_group_definition new_options("OjaNewton options");
  new_options.add(make_option("OjaNewton", oja_newton).keep().help("Online Newton with Oja's Sketch"))
      .add(make_option("sketch_size", ON->m).default_value(10).help("size of sketch"))
      .add(make_option("epoch_size", ON->epoch_size).default_value(1).help("size of epoch"))
      .add(make_option("alpha", ON->alpha).default_value(1.f).help("mutiplicative constant for indentiy"))
      .add(make_option("alpha_inverse", alpha_inverse).help("one over alpha, similar to learning rate"))
      .add(make_option("learning_rate_cnt", ON->learning_rate_cnt)
               .default_value(2.f)
               .help("constant for the learning rate 1/t"))
      .add(make_option("normalize", normalize).help("normalize the features or not"))
      .add(make_option("random_init", random_init).help("randomize initialization of Oja or not"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("OjaNewton"))
    return nullptr;

  ON->all = &all;

  ON->normalize = normalize == "true";
  ON->random_init = random_init == "true";

  if (options.was_supplied("alpha_inverse"))
    ON->alpha = 1.f / alpha_inverse;

  ON->cnt = 0;
  ON->t = 1;
  ON->ev = calloc_or_throw<float>(ON->m + 1);
  ON->b = calloc_or_throw<float>(ON->m + 1);
  ON->D = calloc_or_throw<float>(ON->m + 1);
  ON->A = calloc_or_throw<float*>(ON->m + 1);
  ON->K = calloc_or_throw<float*>(ON->m + 1);
  for (int i = 1; i <= ON->m; i++)
  {
    ON->A[i] = calloc_or_throw<float>(ON->m + 1);
    ON->K[i] = calloc_or_throw<float>(ON->m + 1);
    ON->A[i][i] = 1;
    ON->K[i][i] = 1;
    ON->D[i] = 1;
  }

  ON->buffer = calloc_or_throw<example*>(ON->epoch_size);
  ON->weight_buffer = calloc_or_throw<float>(ON->epoch_size);

  ON->zv = calloc_or_throw<float>(ON->m + 1);
  ON->vv = calloc_or_throw<float>(ON->m + 1);
  ON->tmp = calloc_or_throw<float>(ON->m + 1);

  ON->data.ON = ON.get();
  ON->data.Zx = calloc_or_throw<float>(ON->m + 1);
  ON->data.AZx = calloc_or_throw<float>(ON->m + 1);
  ON->data.delta = calloc_or_throw<float>(ON->m + 1);

  all.weights.stride_shift((uint32_t)ceil(log2(ON->m + 2)));

  learner<OjaNewton, example>& l = init_learner(ON, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_finish_example(keep_example);
  l.set_finish(finish);
  return make_base(l);
}